

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

char * absl::lts_20250127::str_format_internal::anon_unknown_0::PrintFractionalDigitsFast
                 (uint64_t v,char *start,int exp,size_t precision)

{
  char cVar1;
  char *local_38;
  char *p;
  size_t precision_local;
  int exp_local;
  char *start_local;
  uint64_t v_local;
  
  start_local = (char *)(v << (0x40U - (char)exp & 0x3f));
  local_38 = start;
  p = (char *)precision;
  while( true ) {
    if (p == (char *)0x0) {
      if ((char *)0x7fffffffffffffff < start_local) {
        if (start_local < (char *)0x8000000000000001) {
          RoundToEven(local_38 + -1);
        }
        else {
          RoundUp(local_38 + -1);
        }
      }
      return local_38;
    }
    if (start_local == (char *)0x0) break;
    cVar1 = MultiplyBy10WithCarry<unsigned_long>((unsigned_long *)&start_local,'\0');
    *local_38 = cVar1 + '0';
    p = p + -1;
    local_38 = local_38 + 1;
  }
  return local_38;
}

Assistant:

char* PrintFractionalDigitsFast(uint64_t v,
                                char* start,
                                int exp,
                                size_t precision) {
  char *p = start;
  v <<= (64 - exp);
  while (precision > 0) {
    if (!v) return p;
    *p++ = MultiplyBy10WithCarry(&v, 0) + '0';
    --precision;
  }

  // We need to round.
  if (v < 0x8000000000000000) {
    // We round down, so nothing to do.
  } else if (v > 0x8000000000000000) {
    // We round up.
    RoundUp(p - 1);
  } else {
    RoundToEven(p - 1);
  }

  return p;
}